

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDebugDumpLocationSet(FILE *output,xmlLocationSetPtr cur,int depth)

{
  undefined1 local_88 [8];
  char shift [100];
  int i;
  int depth_local;
  xmlLocationSetPtr cur_local;
  FILE *output_local;
  
  shift[0x60] = '\0';
  shift[0x61] = '\0';
  shift[0x62] = '\0';
  shift[99] = '\0';
  for (; (int)shift._96_4_ < depth && (int)shift._96_4_ < 0x19; shift._96_4_ = shift._96_4_ + 1) {
    local_88[shift._96_4_ * 2 + 1] = 0x20;
    local_88[(int)(shift._96_4_ << 1)] = 0x20;
  }
  local_88[shift._96_4_ * 2 + 1] = 0;
  local_88[(int)(shift._96_4_ << 1)] = 0;
  if (cur == (xmlLocationSetPtr)0x0) {
    fprintf((FILE *)output,"%s",local_88);
    fprintf((FILE *)output,"LocationSet is NULL !\n");
  }
  else {
    shift[0x60] = '\0';
    shift[0x61] = '\0';
    shift[0x62] = '\0';
    shift[99] = '\0';
    for (; (int)shift._96_4_ < cur->locNr; shift._96_4_ = shift._96_4_ + 1) {
      fprintf((FILE *)output,"%s",local_88);
      fprintf((FILE *)output,"%d : ",(ulong)(shift._96_4_ + 1));
      xmlXPathDebugDumpObject(output,cur->locTab[(int)shift._96_4_],depth + 1);
    }
  }
  return;
}

Assistant:

static void
xmlXPathDebugDumpLocationSet(FILE *output, xmlLocationSetPtr cur, int depth) {
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;

    if (cur == NULL) {
	fprintf(output, "%s", shift);
	fprintf(output, "LocationSet is NULL !\n");
	return;

    }

    for (i = 0;i < cur->locNr;i++) {
	fprintf(output, "%s", shift);
        fprintf(output, "%d : ", i + 1);
	xmlXPathDebugDumpObject(output, cur->locTab[i], depth + 1);
    }
}